

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial_test.hpp
# Opt level: O3

void TestCIPConstructorGraph<unsigned_long,double>
               (Polynomial<unsigned_long,_double> *polynomial,Vartype vartype,string *type)

{
  __node_base_ptr *pp_Var1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  ulong uVar5;
  runtime_error *this;
  size_t __i;
  long lVar6;
  undefined8 uVar7;
  Spins init_spins_2;
  Spins init_spins_1;
  ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> system;
  Polynomial<double> poly_graph;
  BinaryPolynomialModel<unsigned_long,_double> bpm_cimod;
  random_device rnd;
  mt19937 mt;
  Binaries local_2a30;
  vector<int,_std::allocator<int>_> local_2a18;
  vector<int,_std::allocator<int>_> local_29f8;
  double local_29d8;
  undefined1 local_29d0 [32];
  void *pvStack_29b0;
  int64_t local_29a8;
  pointer pdStack_29a0;
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_2998 [3];
  Polynomial<double> local_28e8;
  BinaryPolynomialModel<unsigned_long,_double> local_2878;
  random_device local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  cimod::BinaryPolynomialModel<unsigned_long,_double>::BinaryPolynomialModel
            (&local_2878,polynomial,vartype);
  local_28e8.poly_key_inv_._M_h._M_buckets = &local_28e8.poly_key_inv_._M_h._M_single_bucket;
  local_28e8.super_Graph._num_spins = 3;
  local_28e8.poly_key_list_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28e8.poly_key_list_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28e8.poly_key_list_.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28e8.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28e8.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28e8.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28e8.poly_key_inv_._M_h._M_bucket_count = 1;
  local_28e8.poly_key_inv_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_28e8.poly_key_inv_._M_h._M_element_count = 0;
  local_28e8.poly_key_inv_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_28e8.poly_key_inv_._M_h._M_rehash_policy._M_next_resize = 0;
  local_28e8.poly_key_inv_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cimod::BinaryPolynomialModel<unsigned_long,_double>::GetPolynomial
            ((Polynomial<unsigned_long,_double> *)&local_2740,&local_2878);
  if ((long *)local_2740.field_0._M_mt._M_x[2] != (long *)0x0) {
    uVar7 = local_2740.field_0._M_mt._M_x[2];
    do {
      local_29d8 = *(double *)(uVar7 + 0x20);
      pdVar4 = openjij::graph::Polynomial<double>::J
                         (&local_28e8,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(uVar7 + 8));
      *pdVar4 = local_29d8;
      uVar7 = *(undefined8 *)uVar7;
    } while (uVar7 != 0);
  }
  std::
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_2740);
  std::random_device::random_device(&local_2740);
  uVar2 = std::random_device::_M_getval();
  local_13b8._M_x[0] = (unsigned_long)uVar2;
  lVar6 = 1;
  uVar5 = local_13b8._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar6);
    local_13b8._M_x[lVar6] = uVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  local_13b8._M_p = 0x270;
  local_29f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_29f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_29f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2a18.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2a18.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2a18.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pp_Var1 = &local_2998[0]._M_single_bucket;
  local_2998[0]._M_buckets = pp_Var1;
  if (vartype == SPIN) {
    local_29d0._0_8_ = 3;
    local_29d0._8_8_ = (pointer)0x0;
    local_29d0._16_8_ = (pointer)0x0;
    local_29d0._24_8_ = (pointer)0x0;
    pvStack_29b0 = (void *)0x0;
    local_29a8 = 0;
    pdStack_29a0 = (pointer)0x0;
    local_2998[0]._M_bucket_count = 1;
    local_2998[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2998[0]._M_element_count = 0;
    local_2998[0]._M_rehash_policy._M_max_load_factor = 1.0;
    local_2998[0]._M_rehash_policy._M_next_resize = 0;
    local_2998[0]._M_single_bucket = (__node_base_ptr)0x0;
    openjij::graph::Graph::
    gen_spin<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (&local_2a30,(Graph *)local_29d0,&local_13b8);
    std::vector<int,_std::allocator<int>_>::operator=(&local_29f8,&local_2a30);
    if (local_2a30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2a30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_2998);
    if (pvStack_29b0 != (void *)0x0) {
      operator_delete(pvStack_29b0,(long)pdStack_29a0 - (long)pvStack_29b0);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)(local_29d0 + 8));
    local_29d0._0_8_ = 3;
    local_29d0._8_8_ = (pointer)0x0;
    local_29d0._16_8_ = (pointer)0x0;
    local_29d0._24_8_ = (pointer)0x0;
    pvStack_29b0 = (void *)0x0;
    local_29a8 = 0;
    pdStack_29a0 = (pointer)0x0;
    local_2998[0]._M_bucket_count = 1;
    local_2998[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2998[0]._M_element_count = 0;
    local_2998[0]._M_rehash_policy._M_max_load_factor = 1.0;
    local_2998[0]._M_rehash_policy._M_next_resize = 0;
    local_2998[0]._M_single_bucket = (__node_base_ptr)0x0;
    local_2998[0]._M_buckets = pp_Var1;
    openjij::graph::Graph::
    gen_spin<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (&local_2a30,(Graph *)local_29d0,&local_13b8);
    std::vector<int,_std::allocator<int>_>::operator=(&local_2a18,&local_2a30);
  }
  else {
    local_29d0._0_8_ = 3;
    local_29d0._8_8_ = (pointer)0x0;
    local_29d0._16_8_ = (pointer)0x0;
    local_29d0._24_8_ = (pointer)0x0;
    pvStack_29b0 = (void *)0x0;
    local_29a8 = 0;
    pdStack_29a0 = (pointer)0x0;
    local_2998[0]._M_bucket_count = 1;
    local_2998[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2998[0]._M_element_count = 0;
    local_2998[0]._M_rehash_policy._M_max_load_factor = 1.0;
    local_2998[0]._M_rehash_policy._M_next_resize = 0;
    local_2998[0]._M_single_bucket = (__node_base_ptr)0x0;
    openjij::graph::Graph::
    gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (&local_2a30,(Graph *)local_29d0,&local_13b8);
    std::vector<int,_std::allocator<int>_>::operator=(&local_29f8,&local_2a30);
    if (local_2a30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2a30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_2998);
    if (pvStack_29b0 != (void *)0x0) {
      operator_delete(pvStack_29b0,(long)pdStack_29a0 - (long)pvStack_29b0);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)(local_29d0 + 8));
    local_29d0._0_8_ = 3;
    local_29d0._8_8_ = (pointer)0x0;
    local_29d0._16_8_ = (pointer)0x0;
    local_29d0._24_8_ = (pointer)0x0;
    pvStack_29b0 = (void *)0x0;
    local_29a8 = 0;
    pdStack_29a0 = (pointer)0x0;
    local_2998[0]._M_bucket_count = 1;
    local_2998[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2998[0]._M_element_count = 0;
    local_2998[0]._M_rehash_policy._M_max_load_factor = 1.0;
    local_2998[0]._M_rehash_policy._M_next_resize = 0;
    local_2998[0]._M_single_bucket = (__node_base_ptr)0x0;
    local_2998[0]._M_buckets = pp_Var1;
    openjij::graph::Graph::
    gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (&local_2a30,(Graph *)local_29d0,&local_13b8);
    std::vector<int,_std::allocator<int>_>::operator=(&local_2a18,&local_2a30);
  }
  if (local_2a30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_2998);
  if (pvStack_29b0 != (void *)0x0) {
    operator_delete(pvStack_29b0,(long)pdStack_29a0 - (long)pvStack_29b0);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)(local_29d0 + 8));
  openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::
  ClassicalIsingPolynomial
            ((ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *)local_29d0,&local_29f8
             ,&local_28e8,vartype);
  iVar3 = std::__cxx11::string::compare((char *)type);
  if (iVar3 == 0) {
    TestCIPSystemDense<double>
              ((ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *)local_29d0);
    openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::reset_variables
              ((ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *)local_29d0,
               &local_2a18);
    TestCIPSystemDense<double>
              ((ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *)local_29d0);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)type);
    if (iVar3 != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown type");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TestCIPSystemSparse<double>
              ((ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *)local_29d0);
    openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::reset_variables
              ((ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *)local_29d0,
               &local_2a18);
    TestCIPSystemSparse<double>
              ((ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *)local_29d0);
  }
  openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::
  ~ClassicalIsingPolynomial
            ((ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *)local_29d0);
  if (local_2a18.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a18.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a18.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a18.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_29f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_29f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_29f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_29f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  std::
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_28e8.poly_key_inv_._M_h);
  if (local_28e8.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28e8.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28e8.poly_value_list_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28e8.poly_value_list_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_28e8.poly_key_list_);
  std::
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_2878.poly_key_inv_._M_h);
  if (local_2878.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2878.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2878.poly_value_list_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2878.poly_value_list_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_2878.poly_key_list_);
  if (local_2878.sorted_variables_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2878.sorted_variables_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2878.sorted_variables_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2878.sorted_variables_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_long>,_std::allocator<std::pair<const_unsigned_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2878.variables_to_integers_._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2878.each_variable_num_._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_2878);
  return;
}

Assistant:

void TestCIPConstructorGraph(const cimod::Polynomial<IndexType, FloatType> &polynomial, cimod::Vartype vartype, std::string type) {
   cimod::BinaryPolynomialModel<IndexType, FloatType> bpm_cimod(polynomial, vartype);
   openjij::graph::Polynomial<FloatType> poly_graph(3);
   for (const auto &it: bpm_cimod.GetPolynomial()) {
      poly_graph.J(it.first) = it.second;
   }
   std::random_device rnd;
   std::mt19937 mt(rnd());
   openjij::graph::Spins init_spins_1;
   openjij::graph::Spins init_spins_2;
   if (vartype == cimod::Vartype::SPIN) {
      init_spins_1 = openjij::graph::Polynomial<FloatType>(3).gen_spin(mt);
      init_spins_2 = openjij::graph::Polynomial<FloatType>(3).gen_spin(mt);
   }
   else {
      init_spins_1 = openjij::graph::Polynomial<FloatType>(3).gen_binary(mt);
      init_spins_2 = openjij::graph::Polynomial<FloatType>(3).gen_binary(mt);
   }
   auto system = openjij::system::make_classical_ising_polynomial(init_spins_1, poly_graph, vartype);
   if (type == "Dense") {
      TestCIPSystemDense(system);
      system.reset_variables(init_spins_2);
      TestCIPSystemDense(system);
   }
   else if (type == "Sparse") {
      TestCIPSystemSparse(system);
      system.reset_variables(init_spins_2);
      TestCIPSystemSparse(system);
   }
   else {
      throw std::runtime_error("Unknown type");
   }
}